

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_gather_stat(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  uint uVar1;
  void *output;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = ref_histogram->nstat;
  if ((long)iVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x14c,"ref_histogram_gather_stat","malloc stats of REF_DBL negative");
    uVar1 = 1;
  }
  else {
    output = malloc((long)iVar4 * 8);
    if (output == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x14c,"ref_histogram_gather_stat","malloc stats of REF_DBL NULL");
      uVar1 = 2;
    }
    else {
      uVar1 = ref_mpi_sum(ref_mpi,ref_histogram->stats,output,iVar4,3);
      if (uVar1 == 0) {
        if (ref_mpi->id == 0) {
          uVar3 = 0;
          uVar2 = (ulong)(uint)ref_histogram->nbin;
          if (ref_histogram->nbin < 1) {
            uVar2 = uVar3;
          }
          iVar4 = 0;
          for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
            iVar4 = iVar4 + ref_histogram->bins[uVar3];
          }
          if (0 < iVar4) {
            uVar3 = 0;
            uVar2 = (ulong)(uint)ref_histogram->nstat;
            if (ref_histogram->nstat < 1) {
              uVar2 = uVar3;
            }
            for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
              ref_histogram->stats[uVar3] = *(double *)((long)output + uVar3 * 8) / (double)iVar4;
            }
          }
        }
        else {
          uVar3 = 0;
          uVar2 = (ulong)(uint)ref_histogram->nstat;
          if (ref_histogram->nstat < 1) {
            uVar2 = uVar3;
          }
          for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
            ref_histogram->stats[uVar3] = 0.0;
          }
        }
        free(output);
        uVar1 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x150,"ref_histogram_gather_stat",(ulong)uVar1,"sum");
      }
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather_stat(REF_HISTOGRAM ref_histogram,
                                             REF_MPI ref_mpi) {
  REF_DBL *stats;
  REF_INT i, observations;

  ref_malloc(stats, ref_histogram_nstat(ref_histogram), REF_DBL);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->stats, stats,
                  ref_histogram_nstat(ref_histogram), REF_DBL_TYPE),
      "sum");

  if (ref_mpi_once(ref_mpi)) {
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    if (observations > 0)
      for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
        ref_histogram_stat(ref_histogram, i) = stats[i] / (REF_DBL)observations;
  } else {
    for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
      ref_histogram_stat(ref_histogram, i) = 0.0;
  }

  ref_free(stats);

  return REF_SUCCESS;
}